

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_substreamsInfo(archive_write *a,coder *coders)

{
  ssize_t sVar1;
  int *in_RSI;
  void *in_RDI;
  uint8_t crc [4];
  int r;
  file *file;
  _7zip_conflict *zip;
  undefined1 local_30 [4];
  int local_2c;
  uint64_t in_stack_ffffffffffffffd8;
  uint64_t val;
  archive_write *a_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  a_00 = *(archive_write **)((long)in_RDI + 0xd0);
  local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
  if (-1 < local_2c) {
    if ((1 < *(ulong *)&(a_00->archive).compression_code) && (*in_RSI != 0)) {
      local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
      if (local_2c < 0) {
        return local_2c;
      }
      local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
      if (local_2c < 0) {
        return local_2c;
      }
      local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
      if (local_2c < 0) {
        return local_2c;
      }
      in_stack_ffffffffffffffd8 = *(uint64_t *)&a_00[0xdc].skip_file_set;
      while (((in_stack_ffffffffffffffd8 != 0 && (*(long *)(in_stack_ffffffffffffffd8 + 0x18) != 0))
             && (*(long *)(*(long *)(in_stack_ffffffffffffffd8 + 0x18) + 0x30) != 0))) {
        local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
        if (local_2c < 0) {
          return local_2c;
        }
        in_stack_ffffffffffffffd8 = *(uint64_t *)(in_stack_ffffffffffffffd8 + 0x18);
      }
    }
    local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8);
    if ((-1 < local_2c) && (local_2c = enc_uint64(a_00,in_stack_ffffffffffffffd8), -1 < local_2c)) {
      for (val = *(uint64_t *)&a_00[0xdc].skip_file_set; (val != 0 && (*(long *)(val + 0x30) != 0));
          val = *(uint64_t *)(val + 0x18)) {
        archive_le32enc(local_30,*(uint32_t *)(val + 0x74));
        sVar1 = compress_out((archive_write *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (size_t)in_RSI,(la_zaction)((ulong)a_00 >> 0x20));
        local_2c = (int)sVar1;
        if (local_2c < 0) {
          return local_2c;
        }
      }
      local_2c = enc_uint64(a_00,val);
      if (-1 < local_2c) {
        local_2c = 0;
      }
    }
  }
  return local_2c;
}

Assistant:

static int
make_substreamsInfo(struct archive_write *a, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;

	/*
	 * Make SubStreamsInfo.
	 */
	r = enc_uint64(a, kSubStreamsInfo);
	if (r < 0)
		return (r);

	if (zip->total_number_nonempty_entry > 1 && coders->codec != _7Z_COPY) {
		/*
		 * Make NumUnPackStream.
		 */
		r = enc_uint64(a, kNumUnPackStream);
		if (r < 0)
			return (r);

		/* Write numUnpackStreams */
		r = enc_uint64(a, zip->total_number_nonempty_entry);
		if (r < 0)
			return (r);

		/*
		 * Make kSize.
		 */
		r = enc_uint64(a, kSize);
		if (r < 0)
			return (r);
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->next == NULL ||
			    file->next->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	}

	/*
	 * Make CRC.
	 */
	r = enc_uint64(a, kCRC);
	if (r < 0)
		return (r);


	/* All are defined */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		uint8_t crc[4];
		if (file->size == 0)
			break;
		archive_le32enc(crc, file->crc32);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);
	return (ARCHIVE_OK);
}